

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_manager.cc
# Opt level: O2

void __thiscall xsettingsd::SettingsManager::~SettingsManager(SettingsManager *this)

{
  Display *pDVar1;
  
  pDVar1 = this->display_;
  if (pDVar1 != (Display *)0x0) {
    if ((this->windows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->windows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      DestroyWindows(this);
      pDVar1 = this->display_;
    }
    XCloseDisplay(pDVar1);
    this->display_ = (Display *)0x0;
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->windows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  SettingsMap::~SettingsMap(&this->settings_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

SettingsManager::~SettingsManager() {
  if (display_) {
    if (!windows_.empty())
      DestroyWindows();
    XCloseDisplay(display_);
    display_ = NULL;
  }
}